

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O0

int __thiscall pstore::database::truncate(database *this,char *__file,__off_t __length)

{
  int extraout_EAX;
  uint64_t old_logical_size;
  uint64_t size_local;
  database *this_local;
  
  if ((this->closed_ & 1U) != 0) {
    raise<pstore::error_code>(store_closed);
  }
  this->modified_ = true;
  old_logical_size = sizes::logical_size(&this->size_);
  storage::map_bytes(&this->storage_,old_logical_size,(uint64_t)__file);
  sizes::truncate_logical_size(&this->size_,(uint64_t)__file);
  storage::truncate_to_physical_size(&this->storage_);
  return extraout_EAX;
}

Assistant:

void database::truncate (std::uint64_t const size) {
        if (closed_) {
            raise (error_code::store_closed);
        }
        modified_ = true;

        // Adjust the memory mapped space if necessary.
        storage_.map_bytes (size_.logical_size (), size);

        size_.truncate_logical_size (size);

        if /*constexpr*/ (
            database::small_files_enabled ()) { //! OCLINT(PH - don't warn that this is a constant)
            this->file ()->truncate (size);
        } else {
            storage_.truncate_to_physical_size ();
        }
    }